

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  int iVar29;
  undefined4 uVar30;
  undefined8 uVar31;
  Ref<embree::Geometry> *pRVar32;
  Geometry *pGVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  Scene *pSVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar52;
  uint uVar53;
  int iVar54;
  AABBNodeMB4D *node1;
  ulong uVar55;
  long lVar56;
  long lVar57;
  RayHitK<4> *pRVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  undefined4 uVar76;
  ulong unaff_R12;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  long lVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar105;
  float fVar109;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar104;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar148;
  float fVar150;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar144;
  undefined1 auVar145 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar154;
  undefined1 auVar155 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  float fVar169;
  float fVar171;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar162;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar182;
  float fVar189;
  float fVar190;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar191;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [16];
  float fVar201;
  uint uVar202;
  float fVar205;
  uint uVar206;
  float fVar207;
  uint uVar208;
  float fVar209;
  uint uVar210;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  StackItemT<embree::NodeRefPtr<4>_> *local_1360;
  float fStack_1350;
  float fStack_134c;
  vbool<4> valid;
  float fStack_1310;
  float fStack_130c;
  undefined1 local_12f8 [8];
  undefined8 uStack_12f0;
  int local_12e8;
  int iStack_12e4;
  undefined8 uStack_12e0;
  RTCFilterFunctionNArguments args;
  float fStack_1280;
  float fStack_127c;
  undefined8 local_1278;
  undefined8 local_1268;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  vfloat<4> tNear;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  float local_10e8 [4];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 local_1068;
  undefined4 uStack_1064;
  undefined4 uStack_1060;
  undefined4 uStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  int local_fc8;
  int iStack_fc4;
  int iStack_fc0;
  int iStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_1360 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_fd8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  uVar76 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_ff8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_f98 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_fe8._4_4_ = uVar76;
  local_fe8._0_4_ = uVar76;
  local_fe8._8_4_ = uVar76;
  local_fe8._12_4_ = uVar76;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  local_fa8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  local_fb8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_fc8 = (tray->tnear).field_0.i[k];
  iStack_fc4 = local_fc8;
  iStack_fc0 = local_fc8;
  iStack_fbc = local_fc8;
  iVar54 = (tray->tfar).field_0.i[k];
  auVar215._4_4_ = iVar54;
  auVar215._0_4_ = iVar54;
  auVar215._8_4_ = iVar54;
  auVar215._12_4_ = iVar54;
  local_1008 = mm_lookupmask_ps._0_8_;
  uStack_1000 = mm_lookupmask_ps._8_8_;
  local_1018 = mm_lookupmask_ps._240_8_;
  uStack_1010 = mm_lookupmask_ps._248_8_;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  auVar145 = local_fe8;
  fVar81 = local_ff8;
  fVar139 = local_ff8;
  fVar154 = local_ff8;
  fVar213 = local_ff8;
  fVar82 = local_fd8;
  fVar83 = local_fd8;
  fVar84 = local_fd8;
  fVar85 = local_fd8;
  do {
    do {
      do {
        if (local_1360 == stack) {
          return;
        }
        pSVar52 = local_1360 + -1;
        local_1360 = local_1360 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar52->dist &&
               (float)pSVar52->dist != *(float *)(ray + k * 4 + 0x80));
      uVar61 = (local_1360->ptr).ptr;
      do {
        if ((uVar61 & 8) == 0) {
          uVar55 = uVar61 & 0xfffffffffffffff0;
          fVar105 = *(float *)(ray + k * 4 + 0x70);
          pfVar26 = (float *)(uVar55 + 0x80 + uVar59);
          pfVar25 = (float *)(uVar55 + 0x20 + uVar59);
          auVar163._0_4_ = ((*pfVar26 * fVar105 + *pfVar25) - fVar82) * local_f98;
          auVar163._4_4_ = ((pfVar26[1] * fVar105 + pfVar25[1]) - fVar83) * fStack_f94;
          auVar163._8_4_ = ((pfVar26[2] * fVar105 + pfVar25[2]) - fVar84) * fStack_f90;
          auVar163._12_4_ = ((pfVar26[3] * fVar105 + pfVar25[3]) - fVar85) * fStack_f8c;
          auVar142._4_4_ = iStack_fc4;
          auVar142._0_4_ = local_fc8;
          auVar142._8_4_ = iStack_fc0;
          auVar142._12_4_ = iStack_fbc;
          pfVar26 = (float *)(uVar55 + 0x80 + uVar60);
          pfVar25 = (float *)(uVar55 + 0x20 + uVar60);
          auVar142 = maxps(auVar142,auVar163);
          auVar184._0_4_ = ((*pfVar26 * fVar105 + *pfVar25) - auVar145._0_4_) * local_fa8;
          auVar184._4_4_ = ((pfVar26[1] * fVar105 + pfVar25[1]) - auVar145._4_4_) * fStack_fa4;
          auVar184._8_4_ = ((pfVar26[2] * fVar105 + pfVar25[2]) - auVar145._8_4_) * fStack_fa0;
          auVar184._12_4_ = ((pfVar26[3] * fVar105 + pfVar25[3]) - auVar145._12_4_) * fStack_f9c;
          pfVar26 = (float *)(uVar55 + 0x80 + uVar62);
          pfVar25 = (float *)(uVar55 + 0x20 + uVar62);
          auVar177._0_4_ = ((*pfVar26 * fVar105 + *pfVar25) - fVar81) * local_fb8;
          auVar177._4_4_ = ((pfVar26[1] * fVar105 + pfVar25[1]) - fVar139) * fStack_fb4;
          auVar177._8_4_ = ((pfVar26[2] * fVar105 + pfVar25[2]) - fVar154) * fStack_fb0;
          auVar177._12_4_ = ((pfVar26[3] * fVar105 + pfVar25[3]) - fVar213) * fStack_fac;
          auVar163 = maxps(auVar184,auVar177);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar142,auVar163);
          pfVar27 = (float *)(uVar55 + 0x80 + (uVar59 ^ 0x10));
          pfVar25 = (float *)(uVar55 + 0x20 + (uVar59 ^ 0x10));
          pfVar28 = (float *)(uVar55 + 0x80 + (uVar60 ^ 0x10));
          pfVar26 = (float *)(uVar55 + 0x20 + (uVar60 ^ 0x10));
          auVar164._0_4_ = ((*pfVar27 * fVar105 + *pfVar25) - fVar82) * local_f98;
          auVar164._4_4_ = ((pfVar27[1] * fVar105 + pfVar25[1]) - fVar83) * fStack_f94;
          auVar164._8_4_ = ((pfVar27[2] * fVar105 + pfVar25[2]) - fVar84) * fStack_f90;
          auVar164._12_4_ = ((pfVar27[3] * fVar105 + pfVar25[3]) - fVar85) * fStack_f8c;
          auVar175._0_4_ = ((*pfVar28 * fVar105 + *pfVar26) - auVar145._0_4_) * local_fa8;
          auVar175._4_4_ = ((pfVar28[1] * fVar105 + pfVar26[1]) - auVar145._4_4_) * fStack_fa4;
          auVar175._8_4_ = ((pfVar28[2] * fVar105 + pfVar26[2]) - auVar145._8_4_) * fStack_fa0;
          auVar175._12_4_ = ((pfVar28[3] * fVar105 + pfVar26[3]) - auVar145._12_4_) * fStack_f9c;
          pfVar26 = (float *)(uVar55 + 0x80 + (uVar62 ^ 0x10));
          pfVar25 = (float *)(uVar55 + 0x20 + (uVar62 ^ 0x10));
          auVar178._0_4_ = ((*pfVar26 * fVar105 + *pfVar25) - fVar81) * local_fb8;
          auVar178._4_4_ = ((pfVar26[1] * fVar105 + pfVar25[1]) - fVar139) * fStack_fb4;
          auVar178._8_4_ = ((pfVar26[2] * fVar105 + pfVar25[2]) - fVar154) * fStack_fb0;
          auVar178._12_4_ = ((pfVar26[3] * fVar105 + pfVar25[3]) - fVar213) * fStack_fac;
          auVar163 = minps(auVar175,auVar178);
          auVar142 = minps(auVar215,auVar164);
          auVar142 = minps(auVar142,auVar163);
          if (((uint)uVar61 & 7) == 6) {
            bVar42 = (fVar105 < *(float *)(uVar55 + 0xf0) && *(float *)(uVar55 + 0xe0) <= fVar105)
                     && tNear.field_0._0_4_ <= auVar142._0_4_;
            bVar43 = (fVar105 < *(float *)(uVar55 + 0xf4) && *(float *)(uVar55 + 0xe4) <= fVar105)
                     && tNear.field_0._4_4_ <= auVar142._4_4_;
            bVar44 = (fVar105 < *(float *)(uVar55 + 0xf8) && *(float *)(uVar55 + 0xe8) <= fVar105)
                     && tNear.field_0._8_4_ <= auVar142._8_4_;
            bVar45 = (fVar105 < *(float *)(uVar55 + 0xfc) && *(float *)(uVar55 + 0xec) <= fVar105)
                     && tNear.field_0._12_4_ <= auVar142._12_4_;
          }
          else {
            bVar42 = tNear.field_0._0_4_ <= auVar142._0_4_;
            bVar43 = tNear.field_0._4_4_ <= auVar142._4_4_;
            bVar44 = tNear.field_0._8_4_ <= auVar142._8_4_;
            bVar45 = tNear.field_0._12_4_ <= auVar142._12_4_;
          }
          auVar86._0_4_ = (uint)bVar42 * -0x80000000;
          auVar86._4_4_ = (uint)bVar43 * -0x80000000;
          auVar86._8_4_ = (uint)bVar44 * -0x80000000;
          auVar86._12_4_ = (uint)bVar45 * -0x80000000;
          uVar76 = movmskps((int)unaff_R12,auVar86);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar76);
        }
        if ((uVar61 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar54 = 4;
          }
          else {
            uVar55 = uVar61 & 0xfffffffffffffff0;
            lVar57 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
              }
            }
            iVar54 = 0;
            uVar61 = *(ulong *)(uVar55 + lVar57 * 8);
            uVar63 = unaff_R12 - 1 & unaff_R12;
            if (uVar63 != 0) {
              uVar53 = tNear.field_0.i[lVar57];
              lVar57 = 0;
              if (uVar63 != 0) {
                for (; (uVar63 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                }
              }
              uVar65 = *(ulong *)(uVar55 + lVar57 * 8);
              uVar202 = tNear.field_0.i[lVar57];
              uVar63 = uVar63 - 1 & uVar63;
              if (uVar63 == 0) {
                if (uVar53 < uVar202) {
                  (local_1360->ptr).ptr = uVar65;
                  local_1360->dist = uVar202;
                  local_1360 = local_1360 + 1;
                }
                else {
                  (local_1360->ptr).ptr = uVar61;
                  local_1360->dist = uVar53;
                  uVar61 = uVar65;
                  local_1360 = local_1360 + 1;
                }
              }
              else {
                auVar143._8_4_ = uVar53;
                auVar143._0_8_ = uVar61;
                auVar143._12_4_ = 0;
                auVar165._8_4_ = uVar202;
                auVar165._0_8_ = uVar65;
                auVar165._12_4_ = 0;
                lVar57 = 0;
                if (uVar63 != 0) {
                  for (; (uVar63 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                  }
                }
                uVar31 = *(undefined8 *)(uVar55 + lVar57 * 8);
                iVar29 = tNear.field_0.i[lVar57];
                auVar155._8_4_ = iVar29;
                auVar155._0_8_ = uVar31;
                auVar155._12_4_ = 0;
                auVar87._8_4_ = -(uint)((int)uVar53 < (int)uVar202);
                uVar63 = uVar63 - 1 & uVar63;
                if (uVar63 == 0) {
                  auVar87._4_4_ = auVar87._8_4_;
                  auVar87._0_4_ = auVar87._8_4_;
                  auVar87._12_4_ = auVar87._8_4_;
                  auVar176._8_4_ = uVar202;
                  auVar176._0_8_ = uVar65;
                  auVar176._12_4_ = 0;
                  auVar177 = blendvps(auVar176,auVar143,auVar87);
                  auVar142 = blendvps(auVar143,auVar165,auVar87);
                  auVar88._8_4_ = -(uint)(auVar177._8_4_ < iVar29);
                  auVar88._4_4_ = auVar88._8_4_;
                  auVar88._0_4_ = auVar88._8_4_;
                  auVar88._12_4_ = auVar88._8_4_;
                  auVar166._8_4_ = iVar29;
                  auVar166._0_8_ = uVar31;
                  auVar166._12_4_ = 0;
                  auVar163 = blendvps(auVar166,auVar177,auVar88);
                  auVar177 = blendvps(auVar177,auVar155,auVar88);
                  auVar89._8_4_ = -(uint)(auVar142._8_4_ < auVar177._8_4_);
                  auVar89._4_4_ = auVar89._8_4_;
                  auVar89._0_4_ = auVar89._8_4_;
                  auVar89._12_4_ = auVar89._8_4_;
                  SVar156 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar177,auVar142,auVar89);
                  SVar144 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar142,auVar177,auVar89);
                  *local_1360 = SVar144;
                  local_1360[1] = SVar156;
                  uVar61 = auVar163._0_8_;
                  local_1360 = local_1360 + 2;
                }
                else {
                  lVar57 = 0;
                  if (uVar63 != 0) {
                    for (; (uVar63 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                    }
                  }
                  auVar90._4_4_ = auVar87._8_4_;
                  auVar90._0_4_ = auVar87._8_4_;
                  auVar90._8_4_ = auVar87._8_4_;
                  auVar90._12_4_ = auVar87._8_4_;
                  auVar178 = blendvps(auVar165,auVar143,auVar90);
                  auVar142 = blendvps(auVar143,auVar165,auVar90);
                  auVar183._8_4_ = tNear.field_0.i[lVar57];
                  auVar183._0_8_ = *(undefined8 *)(uVar55 + lVar57 * 8);
                  auVar183._12_4_ = 0;
                  auVar91._8_4_ = -(uint)(iVar29 < tNear.field_0.i[lVar57]);
                  auVar91._4_4_ = auVar91._8_4_;
                  auVar91._0_4_ = auVar91._8_4_;
                  auVar91._12_4_ = auVar91._8_4_;
                  auVar177 = blendvps(auVar183,auVar155,auVar91);
                  auVar163 = blendvps(auVar155,auVar183,auVar91);
                  auVar92._8_4_ = -(uint)(auVar142._8_4_ < auVar163._8_4_);
                  auVar92._4_4_ = auVar92._8_4_;
                  auVar92._0_4_ = auVar92._8_4_;
                  auVar92._12_4_ = auVar92._8_4_;
                  auVar184 = blendvps(auVar163,auVar142,auVar92);
                  SVar144 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar142,auVar163,auVar92);
                  auVar93._8_4_ = -(uint)(auVar178._8_4_ < auVar177._8_4_);
                  auVar93._4_4_ = auVar93._8_4_;
                  auVar93._0_4_ = auVar93._8_4_;
                  auVar93._12_4_ = auVar93._8_4_;
                  auVar142 = blendvps(auVar177,auVar178,auVar93);
                  auVar163 = blendvps(auVar178,auVar177,auVar93);
                  auVar94._8_4_ = -(uint)(auVar163._8_4_ < auVar184._8_4_);
                  auVar94._4_4_ = auVar94._8_4_;
                  auVar94._0_4_ = auVar94._8_4_;
                  auVar94._12_4_ = auVar94._8_4_;
                  SVar156 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar184,auVar163,auVar94);
                  SVar179 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar163,auVar184,auVar94);
                  *local_1360 = SVar144;
                  local_1360[1] = SVar179;
                  local_1360[2] = SVar156;
                  uVar61 = auVar142._0_8_;
                  local_1360 = local_1360 + 3;
                }
              }
            }
          }
        }
        else {
          iVar54 = 6;
        }
      } while (iVar54 == 0);
    } while (iVar54 != 6);
    uVar55 = (ulong)((uint)uVar61 & 0xf);
    if (uVar55 != 8) {
      uVar61 = uVar61 & 0xfffffffffffffff0;
      lVar57 = 0;
      do {
        lVar56 = lVar57 * 0x60;
        pRVar32 = (context->scene->geometries).items;
        pGVar33 = pRVar32[*(uint *)(uVar61 + 0x40 + lVar56)].ptr;
        fVar81 = (pGVar33->time_range).lower;
        fVar139 = (pGVar33->time_range).upper - fVar81;
        fVar154 = ((*(float *)(ray + k * 4 + 0x70) - fVar81) / fVar139) * pGVar33->fnumTimeSegments;
        auVar145 = roundss(ZEXT416((uint)fVar139),ZEXT416((uint)fVar154),9);
        fVar81 = pGVar33->fnumTimeSegments + -1.0;
        if (fVar81 <= auVar145._0_4_) {
          auVar145._0_4_ = fVar81;
        }
        fVar81 = 0.0;
        if (0.0 <= auVar145._0_4_) {
          fVar81 = auVar145._0_4_;
        }
        lVar64 = (long)(int)fVar81 * 0x38;
        lVar34 = *(long *)(*(long *)&pGVar33[2].numPrimitives + lVar64);
        uVar78 = (ulong)*(uint *)(uVar61 + 4 + lVar56);
        pfVar25 = (float *)(lVar34 + (ulong)*(uint *)(uVar61 + lVar56) * 4);
        uVar66 = (ulong)*(uint *)(uVar61 + 0x10 + lVar56);
        pfVar26 = (float *)(lVar34 + uVar66 * 4);
        uVar67 = (ulong)*(uint *)(uVar61 + 0x20 + lVar56);
        pfVar27 = (float *)(lVar34 + uVar67 * 4);
        uVar68 = (ulong)*(uint *)(uVar61 + 0x30 + lVar56);
        pfVar28 = (float *)(lVar34 + uVar68 * 4);
        lVar35 = *(long *)&pRVar32[*(uint *)(uVar61 + 0x44 + lVar56)].ptr[2].numPrimitives;
        lVar34 = *(long *)(lVar35 + lVar64);
        pfVar1 = (float *)(lVar34 + uVar78 * 4);
        uVar69 = (ulong)*(uint *)(uVar61 + 0x14 + lVar56);
        pfVar2 = (float *)(lVar34 + uVar69 * 4);
        uVar70 = (ulong)*(uint *)(uVar61 + 0x24 + lVar56);
        pfVar3 = (float *)(lVar34 + uVar70 * 4);
        uVar71 = (ulong)*(uint *)(uVar61 + 0x34 + lVar56);
        pfVar4 = (float *)(lVar34 + uVar71 * 4);
        lVar36 = *(long *)&pRVar32[*(uint *)(uVar61 + 0x48 + lVar56)].ptr[2].numPrimitives;
        lVar37 = *(long *)(lVar36 + lVar64);
        uVar77 = (ulong)*(uint *)(uVar61 + 8 + lVar56);
        lVar34 = lVar37 + uVar77 * 4;
        uVar72 = (ulong)*(uint *)(uVar61 + 0x18 + lVar56);
        puVar5 = (undefined4 *)(lVar37 + uVar72 * 4);
        uVar73 = (ulong)*(uint *)(uVar61 + 0x28 + lVar56);
        uVar74 = (ulong)*(uint *)(uVar61 + 0x38 + lVar56);
        puVar6 = (undefined4 *)(lVar37 + uVar74 * 4);
        fVar154 = fVar154 - fVar81;
        lVar38 = *(long *)&pRVar32[*(uint *)(uVar61 + 0x4c + lVar56)].ptr[2].numPrimitives;
        lVar39 = *(long *)(lVar38 + lVar64);
        uVar63 = (ulong)*(uint *)(uVar61 + 0xc + lVar56);
        lVar64 = lVar39 + uVar63 * 4;
        uVar65 = (ulong)*(uint *)(uVar61 + 0x1c + lVar56);
        puVar7 = (undefined4 *)(lVar39 + uVar65 * 4);
        uVar79 = (ulong)*(uint *)(uVar61 + 0x2c + lVar56);
        uVar75 = (ulong)*(uint *)(uVar61 + 0x3c + lVar56);
        puVar8 = (undefined4 *)(lVar39 + uVar75 * 4);
        local_1218 = CONCAT44(*puVar7,*puVar5);
        lVar80 = (long)((int)fVar81 + 1) * 0x38;
        lVar40 = *(long *)(*(long *)&pGVar33[2].numPrimitives + lVar80);
        pfVar9 = (float *)(lVar40 + (ulong)*(uint *)(uVar61 + lVar56) * 4);
        lVar36 = *(long *)(lVar36 + lVar80);
        pfVar10 = (float *)(lVar36 + uVar77 * 4);
        local_f88 = CONCAT44(pfVar4[2],pfVar28[2]);
        stack[0].ptr.ptr._4_4_ = puVar8[2];
        stack[0].ptr.ptr._0_4_ = puVar6[2];
        local_1278 = (undefined8 *)CONCAT44(*puVar8,*puVar6);
        lVar35 = *(long *)(lVar35 + lVar80);
        pfVar11 = (float *)(lVar35 + uVar78 * 4);
        lVar38 = *(long *)(lVar38 + lVar80);
        pfVar12 = (float *)(lVar38 + uVar63 * 4);
        pfVar13 = (float *)(lVar40 + uVar66 * 4);
        pfVar14 = (float *)(lVar36 + uVar72 * 4);
        pfVar15 = (float *)(lVar35 + uVar69 * 4);
        pfVar16 = (float *)(lVar38 + uVar65 * 4);
        pfVar17 = (float *)(lVar40 + uVar67 * 4);
        pfVar18 = (float *)(lVar36 + uVar73 * 4);
        pfVar19 = (float *)(lVar35 + uVar70 * 4);
        pfVar20 = (float *)(lVar38 + uVar79 * 4);
        pfVar21 = (float *)(lVar40 + uVar68 * 4);
        pfVar22 = (float *)(lVar36 + uVar74 * 4);
        pfVar23 = (float *)(lVar35 + uVar71 * 4);
        pfVar24 = (float *)(lVar38 + uVar75 * 4);
        fVar81 = 1.0 - fVar154;
        fVar117 = *pfVar25 * fVar81 + *pfVar9 * fVar154;
        fVar129 = *pfVar1 * fVar81 + *pfVar11 * fVar154;
        fVar133 = fStack_1350 * fVar81 + *pfVar10 * fVar154;
        fVar136 = fStack_134c * fVar81 + *pfVar12 * fVar154;
        fVar118 = pfVar25[1] * fVar81 + pfVar9[1] * fVar154;
        fVar130 = pfVar1[1] * fVar81 + pfVar11[1] * fVar154;
        fVar134 = *(float *)(lVar34 + 4) * fVar81 + pfVar10[1] * fVar154;
        fVar137 = *(float *)(lVar64 + 4) * fVar81 + pfVar12[1] * fVar154;
        fVar119 = pfVar25[2] * fVar81 + pfVar9[2] * fVar154;
        fVar131 = pfVar1[2] * fVar81 + pfVar11[2] * fVar154;
        fVar135 = *(float *)(lVar34 + 8) * fVar81 + pfVar10[2] * fVar154;
        fVar138 = *(float *)(lVar64 + 8) * fVar81 + pfVar12[2] * fVar154;
        fVar120 = *pfVar26 * fVar81 + *pfVar13 * fVar154;
        fVar132 = *pfVar2 * fVar81 + *pfVar15 * fVar154;
        fStack_1220 = fStack_1220 * fVar81 + *pfVar14 * fVar154;
        fStack_121c = fStack_121c * fVar81 + *pfVar16 * fVar154;
        fVar140 = pfVar26[1] * fVar81 + pfVar13[1] * fVar154;
        fVar148 = pfVar2[1] * fVar81 + pfVar15[1] * fVar154;
        fVar150 = (float)puVar5[1] * fVar81 + pfVar14[1] * fVar154;
        fVar152 = (float)puVar7[1] * fVar81 + pfVar16[1] * fVar154;
        fVar82 = pfVar26[2] * fVar81 + pfVar13[2] * fVar154;
        fVar105 = pfVar2[2] * fVar81 + pfVar15[2] * fVar154;
        fVar109 = (float)puVar5[2] * fVar81 + pfVar14[2] * fVar154;
        fVar113 = (float)puVar7[2] * fVar81 + pfVar16[2] * fVar154;
        fVar83 = *pfVar27 * fVar81 + *pfVar17 * fVar154;
        fVar106 = *pfVar3 * fVar81 + *pfVar19 * fVar154;
        fVar110 = fStack_1310 * fVar81 + *pfVar18 * fVar154;
        fVar114 = fStack_130c * fVar81 + *pfVar20 * fVar154;
        fVar84 = pfVar27[1] * fVar81 + pfVar17[1] * fVar154;
        fVar107 = pfVar3[1] * fVar81 + pfVar19[1] * fVar154;
        fVar111 = *(float *)(lVar37 + uVar73 * 4 + 4) * fVar81 + pfVar18[1] * fVar154;
        fVar115 = *(float *)(lVar39 + uVar79 * 4 + 4) * fVar81 + pfVar20[1] * fVar154;
        fVar85 = pfVar27[2] * fVar81 + pfVar17[2] * fVar154;
        fVar108 = pfVar3[2] * fVar81 + pfVar19[2] * fVar154;
        fVar112 = (float)uStack_12f0 * fVar81 + pfVar18[2] * fVar154;
        fVar116 = uStack_12f0._4_4_ * fVar81 + pfVar20[2] * fVar154;
        fVar230 = *pfVar28 * fVar81 + *pfVar21 * fVar154;
        fVar231 = *pfVar4 * fVar81 + *pfVar23 * fVar154;
        fVar232 = fStack_1280 * fVar81 + *pfVar22 * fVar154;
        fVar233 = fStack_127c * fVar81 + *pfVar24 * fVar154;
        fVar161 = pfVar28[1] * fVar81 + pfVar21[1] * fVar154;
        fVar169 = pfVar4[1] * fVar81 + pfVar23[1] * fVar154;
        fVar171 = (float)puVar6[1] * fVar81 + pfVar22[1] * fVar154;
        fVar173 = (float)puVar8[1] * fVar81 + pfVar24[1] * fVar154;
        fVar241 = fVar81 * pfVar28[2] + fVar154 * pfVar21[2];
        fVar242 = fVar81 * pfVar4[2] + fVar154 * pfVar23[2];
        fVar243 = fVar81 * fStack_f80 + fVar154 * pfVar22[2];
        fVar244 = fVar81 * fStack_f7c + fVar154 * pfVar24[2];
        fVar192 = fVar118 - fVar140;
        fVar195 = fVar130 - fVar148;
        fVar197 = fVar134 - fVar150;
        fVar199 = fVar137 - fVar152;
        fVar211 = fVar119 - fVar82;
        fVar216 = fVar131 - fVar105;
        fVar218 = fVar135 - fVar109;
        fVar220 = fVar138 - fVar113;
        fVar182 = fVar161 - fVar118;
        fVar189 = fVar169 - fVar130;
        fVar190 = fVar171 - fVar134;
        fVar191 = fVar173 - fVar137;
        fVar201 = fVar241 - fVar119;
        fVar205 = fVar242 - fVar131;
        fVar207 = fVar243 - fVar135;
        fVar209 = fVar244 - fVar138;
        local_10e8[0] = fVar211 * fVar182 - fVar192 * fVar201;
        local_10e8[1] = fVar216 * fVar189 - fVar195 * fVar205;
        local_10e8[2] = fVar218 * fVar190 - fVar197 * fVar207;
        local_10e8[3] = fVar220 * fVar191 - fVar199 * fVar209;
        fVar162 = fVar230 - fVar117;
        fVar170 = fVar231 - fVar129;
        fVar172 = fVar232 - fVar133;
        fVar174 = fVar233 - fVar136;
        fVar81 = *(float *)(ray + k * 4);
        fVar234 = fVar117 - fVar81;
        fVar236 = fVar129 - fVar81;
        fVar238 = fVar133 - fVar81;
        fVar81 = fVar136 - fVar81;
        fVar139 = *(float *)(ray + k * 4 + 0x10);
        fVar118 = fVar118 - fVar139;
        fVar130 = fVar130 - fVar139;
        fVar134 = fVar134 - fVar139;
        fVar137 = fVar137 - fVar139;
        fVar139 = *(float *)(ray + k * 4 + 0x40);
        fVar154 = *(float *)(ray + k * 4 + 0x50);
        fVar141 = fVar234 * fVar154 - fVar118 * fVar139;
        fVar149 = fVar236 * fVar154 - fVar130 * fVar139;
        fVar151 = fVar238 * fVar154 - fVar134 * fVar139;
        fVar153 = fVar81 * fVar154 - fVar137 * fVar139;
        fVar117 = fVar117 - fVar120;
        fVar129 = fVar129 - fVar132;
        fVar133 = fVar133 - fStack_1220;
        fVar136 = fVar136 - fStack_121c;
        fVar222 = fVar117 * fVar201 - fVar211 * fVar162;
        fVar223 = fVar129 * fVar205 - fVar216 * fVar170;
        fVar224 = fVar133 * fVar207 - fVar218 * fVar172;
        fVar225 = fVar136 * fVar209 - fVar220 * fVar174;
        fVar213 = *(float *)(ray + k * 4 + 0x20);
        fVar119 = fVar119 - fVar213;
        fVar131 = fVar131 - fVar213;
        fVar135 = fVar135 - fVar213;
        fVar138 = fVar138 - fVar213;
        fVar213 = *(float *)(ray + k * 4 + 0x60);
        fVar235 = fVar119 * fVar139 - fVar234 * fVar213;
        fVar237 = fVar131 * fVar139 - fVar236 * fVar213;
        fVar239 = fVar135 * fVar139 - fVar238 * fVar213;
        fVar240 = fVar138 * fVar139 - fVar81 * fVar213;
        fVar193 = fVar192 * fVar162 - fVar117 * fVar182;
        fVar196 = fVar195 * fVar170 - fVar129 * fVar189;
        fVar198 = fVar197 * fVar172 - fVar133 * fVar190;
        fVar200 = fVar199 * fVar174 - fVar136 * fVar191;
        fVar212 = fVar118 * fVar213 - fVar119 * fVar154;
        fVar217 = fVar130 * fVar213 - fVar131 * fVar154;
        fVar219 = fVar134 * fVar213 - fVar135 * fVar154;
        fVar221 = fVar137 * fVar213 - fVar138 * fVar154;
        local_1268 = CONCAT44(fVar223,fVar222);
        fVar226 = fVar139 * local_10e8[0] + fVar154 * fVar222 + fVar213 * fVar193;
        fVar227 = fVar139 * local_10e8[1] + fVar154 * fVar223 + fVar213 * fVar196;
        fVar228 = fVar139 * local_10e8[2] + fVar154 * fVar224 + fVar213 * fVar198;
        fVar229 = fVar139 * local_10e8[3] + fVar154 * fVar225 + fVar213 * fVar200;
        uVar202 = (uint)fVar226 & 0x80000000;
        uVar206 = (uint)fVar227 & 0x80000000;
        uVar208 = (uint)fVar228 & 0x80000000;
        uVar210 = (uint)fVar229 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar162 * fVar212 + fVar182 * fVar235 + fVar201 * fVar141) ^ uVar202;
        tNear.field_0.i[1] =
             (uint)(fVar170 * fVar217 + fVar189 * fVar237 + fVar205 * fVar149) ^ uVar206;
        tNear.field_0.i[2] =
             (uint)(fVar172 * fVar219 + fVar190 * fVar239 + fVar207 * fVar151) ^ uVar208;
        tNear.field_0.i[3] =
             (uint)(fVar174 * fVar221 + fVar191 * fVar240 + fVar209 * fVar153) ^ uVar210;
        fVar213 = (float)((uint)(fVar212 * fVar117 + fVar235 * fVar192 + fVar141 * fVar211) ^
                         uVar202);
        fVar117 = (float)((uint)(fVar217 * fVar129 + fVar237 * fVar195 + fVar149 * fVar216) ^
                         uVar206);
        fVar129 = (float)((uint)(fVar219 * fVar133 + fVar239 * fVar197 + fVar151 * fVar218) ^
                         uVar208);
        fVar133 = (float)((uint)(fVar221 * fVar136 + fVar240 * fVar199 + fVar153 * fVar220) ^
                         uVar210);
        fVar139 = ABS(fVar226);
        fVar154 = ABS(fVar227);
        auVar146._0_8_ = CONCAT44(fVar227,fVar226) & 0x7fffffff7fffffff;
        auVar146._8_4_ = ABS(fVar228);
        auVar146._12_4_ = ABS(fVar229);
        bVar44 = ((0.0 <= fVar213 && 0.0 <= tNear.field_0.v[0]) && fVar226 != 0.0) &&
                 tNear.field_0.v[0] + fVar213 <= fVar139;
        auVar185._0_4_ = -(uint)bVar44;
        bVar45 = ((0.0 <= fVar117 && 0.0 <= tNear.field_0.v[1]) && fVar227 != 0.0) &&
                 tNear.field_0.v[1] + fVar117 <= fVar154;
        auVar185._4_4_ = -(uint)bVar45;
        bVar43 = ((0.0 <= fVar129 && 0.0 <= tNear.field_0.v[2]) && fVar228 != 0.0) &&
                 tNear.field_0.v[2] + fVar129 <= auVar146._8_4_;
        auVar185._8_4_ = -(uint)bVar43;
        bVar42 = ((0.0 <= fVar133 && 0.0 <= tNear.field_0.v[3]) && fVar229 != 0.0) &&
                 tNear.field_0.v[3] + fVar133 <= auVar146._12_4_;
        auVar185._12_4_ = -(uint)bVar42;
        lVar34 = uVar61 + lVar56;
        uVar53 = movmskps((int)lVar56,auVar185);
        if (uVar53 != 0) {
          fVar119 = (float)(uVar202 ^
                           (uint)(fVar234 * local_10e8[0] + fVar118 * fVar222 + fVar119 * fVar193));
          fVar130 = (float)(uVar206 ^
                           (uint)(fVar236 * local_10e8[1] + fVar130 * fVar223 + fVar131 * fVar196));
          fVar131 = (float)(uVar208 ^
                           (uint)(fVar238 * local_10e8[2] + fVar134 * fVar224 + fVar135 * fVar198));
          fVar134 = (float)(uVar210 ^
                           (uint)(fVar81 * local_10e8[3] + fVar137 * fVar225 + fVar138 * fVar200));
          fVar81 = *(float *)(ray + k * 4 + 0x30);
          fVar118 = *(float *)(ray + k * 4 + 0x80);
          auVar203._0_4_ = fVar118 * fVar139;
          auVar203._4_4_ = fVar118 * fVar154;
          auVar203._8_4_ = fVar118 * auVar146._8_4_;
          auVar203._12_4_ = fVar118 * auVar146._12_4_;
          bVar44 = (fVar81 * fVar139 < fVar119 && fVar119 <= auVar203._0_4_) && bVar44;
          bVar45 = (fVar81 * fVar154 < fVar130 && fVar130 <= auVar203._4_4_) && bVar45;
          valid.field_0._0_8_ = CONCAT44(-(uint)bVar45,-(uint)bVar44);
          bVar43 = (fVar81 * auVar146._8_4_ < fVar131 && fVar131 <= auVar203._8_4_) && bVar43;
          valid.field_0.i[2] = -(uint)bVar43;
          bVar42 = (fVar81 * auVar146._12_4_ < fVar134 && fVar134 <= auVar203._12_4_) && bVar42;
          valid.field_0.i[3] = -(uint)bVar42;
          uVar53 = movmskps(uVar53,(undefined1  [16])valid.field_0);
          if (uVar53 != 0) {
            local_10b8._8_8_ = uStack_1000;
            local_10b8._0_8_ = local_1008;
            auVar145 = rcpps(auVar203,auVar146);
            fVar81 = auVar145._0_4_;
            fVar118 = auVar145._4_4_;
            fVar136 = auVar145._8_4_;
            fVar137 = auVar145._12_4_;
            fVar138 = (float)DAT_01feca10;
            fVar141 = DAT_01feca10._4_4_;
            fVar149 = DAT_01feca10._12_4_;
            fVar135 = DAT_01feca10._8_4_;
            fVar81 = (fVar138 - fVar139 * fVar81) * fVar81 + fVar81;
            fVar118 = (fVar141 - fVar154 * fVar118) * fVar118 + fVar118;
            fVar136 = (fVar135 - auVar146._8_4_ * fVar136) * fVar136 + fVar136;
            fVar137 = (fVar149 - auVar146._12_4_ * fVar137) * fVar137 + fVar137;
            fVar119 = fVar119 * fVar81;
            fVar130 = fVar130 * fVar118;
            fVar131 = fVar131 * fVar136;
            fVar134 = fVar134 * fVar137;
            local_10f8 = CONCAT44(fVar130,fVar119);
            uStack_10f0 = CONCAT44(fVar134,fVar131);
            auVar167._0_4_ = tNear.field_0.v[0] * fVar81;
            auVar167._4_4_ = tNear.field_0.v[1] * fVar118;
            auVar167._8_4_ = tNear.field_0.v[2] * fVar136;
            auVar167._12_4_ = tNear.field_0.v[3] * fVar137;
            auVar145 = minps(auVar167,_DAT_01feca10);
            auVar187._0_4_ = fVar81 * fVar213;
            auVar187._4_4_ = fVar118 * fVar117;
            auVar187._8_4_ = fVar136 * fVar129;
            auVar187._12_4_ = fVar137 * fVar133;
            auVar215 = minps(auVar187,_DAT_01feca10);
            auVar147._0_4_ = fVar138 - auVar145._0_4_;
            auVar147._4_4_ = fVar141 - auVar145._4_4_;
            auVar147._8_4_ = fVar135 - auVar145._8_4_;
            auVar147._12_4_ = fVar149 - auVar145._12_4_;
            auVar204._0_4_ = fVar138 - auVar215._0_4_;
            auVar204._4_4_ = fVar141 - auVar215._4_4_;
            auVar204._8_4_ = fVar135 - auVar215._8_4_;
            auVar204._12_4_ = fVar149 - auVar215._12_4_;
            local_1118 = blendvps(auVar145,auVar147,local_10b8);
            local_1108 = blendvps(auVar215,auVar204,local_10b8);
            auVar168._4_4_ = fVar130;
            auVar168._0_4_ = fVar119;
            auVar168._8_4_ = fVar131;
            auVar168._12_4_ = fVar134;
            local_10d8 = local_1268;
            uStack_10d0 = CONCAT44(fVar225,fVar224);
            local_10c8 = CONCAT44(fVar196,fVar193);
            uStack_10c0 = CONCAT44(fVar200,fVar198);
            auVar95._8_4_ = valid.field_0.i[2];
            auVar95._0_8_ = valid.field_0._0_8_;
            auVar95._12_4_ = valid.field_0.i[3];
            auVar215 = blendvps(_DAT_01feb9f0,auVar168,auVar95);
            auVar157._4_4_ = auVar215._0_4_;
            auVar157._0_4_ = auVar215._4_4_;
            auVar157._8_4_ = auVar215._12_4_;
            auVar157._12_4_ = auVar215._8_4_;
            auVar145 = minps(auVar157,auVar215);
            auVar96._0_8_ = auVar145._8_8_;
            auVar96._8_4_ = auVar145._0_4_;
            auVar96._12_4_ = auVar145._4_4_;
            auVar145 = minps(auVar96,auVar145);
            auVar97._0_8_ =
                 CONCAT44(-(uint)(auVar145._4_4_ == auVar215._4_4_ && bVar45),
                          -(uint)(auVar145._0_4_ == auVar215._0_4_ && bVar44));
            auVar97._8_4_ = -(uint)(auVar145._8_4_ == auVar215._8_4_ && bVar43);
            auVar97._12_4_ = -(uint)(auVar145._12_4_ == auVar215._12_4_ && bVar42);
            iVar54 = movmskps(uVar53,auVar97);
            aVar121 = valid.field_0;
            if (iVar54 != 0) {
              aVar121.i[2] = auVar97._8_4_;
              aVar121._0_8_ = auVar97._0_8_;
              aVar121.i[3] = auVar97._12_4_;
            }
            uVar76 = movmskps(iVar54,(undefined1  [16])aVar121);
            uVar63 = CONCAT44((int)((ulong)lVar56 >> 0x20),uVar76);
            lVar56 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
LAB_00297153:
            local_1048._4_4_ = *(uint *)(lVar34 + 0x40 + lVar56 * 4);
            pRVar58 = (RayHitK<4> *)(ulong)(uint)local_1048._4_4_;
            lVar64 = *(long *)(*(long *)(local_1218 + 0x1e8) + (long)pRVar58 * 8);
            if ((*(uint *)(lVar64 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar56] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (*(long *)(lVar64 + 0x40) == 0)) {
                uVar76 = *(undefined4 *)(local_1118 + lVar56 * 4);
                uVar30 = *(undefined4 *)(local_1108 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) =
                     *(undefined4 *)((long)&local_10f8 + lVar56 * 4);
                *(float *)(ray + k * 4 + 0xc0) = local_10e8[lVar56];
                *(undefined4 *)(ray + k * 4 + 0xd0) =
                     *(undefined4 *)((long)&local_10d8 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)((long)&local_10c8 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar76;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar30;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar34 + 0x50 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0x120) = local_1048._4_4_;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar53 = context->user->instPrimID[0];
                *(uint *)(ray + k * 4 + 0x140) = uVar53;
                goto LAB_00296dc8;
              }
              local_1078 = *(undefined4 *)(local_1118 + lVar56 * 4);
              local_1068 = *(undefined4 *)(local_1108 + lVar56 * 4);
              local_10a8._4_4_ = local_10e8[lVar56];
              local_1098._4_4_ = *(undefined4 *)((long)&local_10d8 + lVar56 * 4);
              uVar76 = *(undefined4 *)(lVar34 + 0x50 + lVar56 * 4);
              local_1058._4_4_ = uVar76;
              local_1058._0_4_ = uVar76;
              local_1058._8_4_ = uVar76;
              local_1058._12_4_ = uVar76;
              uVar76 = *(undefined4 *)((long)&local_10c8 + lVar56 * 4);
              local_1088._4_4_ = uVar76;
              local_1088._0_4_ = uVar76;
              local_1088._8_4_ = uVar76;
              local_1088._12_4_ = uVar76;
              local_10a8._0_4_ = local_10a8._4_4_;
              fStack_10a0 = (float)local_10a8._4_4_;
              fStack_109c = (float)local_10a8._4_4_;
              local_1098._0_4_ = local_1098._4_4_;
              local_1098._8_4_ = local_1098._4_4_;
              local_1098._12_4_ = local_1098._4_4_;
              uStack_1074 = local_1078;
              uStack_1070 = local_1078;
              uStack_106c = local_1078;
              uStack_1064 = local_1068;
              uStack_1060 = local_1068;
              uStack_105c = local_1068;
              local_1048._0_4_ = local_1048._4_4_;
              local_1048._8_4_ = local_1048._4_4_;
              local_1048._12_4_ = local_1048._4_4_;
              local_1038 = context->user->instID[0];
              uStack_1034 = local_1038;
              uStack_1030 = local_1038;
              uStack_102c = local_1038;
              local_1028 = context->user->instPrimID[0];
              uStack_1024 = local_1028;
              uStack_1020 = local_1028;
              uStack_101c = local_1028;
              uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)&local_10f8 + lVar56 * 4);
              uStack_12e0 = local_1278[1];
              local_12e8 = (int)*local_1278;
              iStack_12e4 = (int)((ulong)*local_1278 >> 0x20);
              args.valid = &local_12e8;
              args.geometryUserPtr = *(void **)(lVar64 + 0x18);
              args.context = context->user;
              args.hit = (RTCHitN *)local_10a8;
              args.N = 4;
              pRVar58 = *(RayHitK<4> **)(lVar64 + 0x40);
              args.ray = (RTCRayN *)ray;
              if (pRVar58 != (RayHitK<4> *)0x0) {
                pRVar58 = (RayHitK<4> *)(*(code *)pRVar58)(&args);
              }
              auVar48._4_4_ = iStack_12e4;
              auVar48._0_4_ = local_12e8;
              auVar48._8_8_ = uStack_12e0;
              if (auVar48 == (undefined1  [16])0x0) {
                auVar122._8_4_ = 0xffffffff;
                auVar122._0_8_ = 0xffffffffffffffff;
                auVar122._12_4_ = 0xffffffff;
                auVar122 = auVar122 ^ _DAT_01febe20;
              }
              else {
                pRVar58 = (RayHitK<4> *)context->args->filter;
                if ((pRVar58 != (RayHitK<4> *)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar64 + 0x3e) & 0x40) != 0)))) {
                  pRVar58 = (RayHitK<4> *)(*(code *)pRVar58)(&args);
                }
                auVar49._4_4_ = iStack_12e4;
                auVar49._0_4_ = local_12e8;
                auVar49._8_8_ = uStack_12e0;
                auVar98._0_4_ = -(uint)(local_12e8 == 0);
                auVar98._4_4_ = -(uint)(iStack_12e4 == 0);
                auVar98._8_4_ = -(uint)((int)uStack_12e0 == 0);
                auVar98._12_4_ = -(uint)((int)((ulong)uStack_12e0 >> 0x20) == 0);
                auVar122 = auVar98 ^ _DAT_01febe20;
                if (auVar49 != (undefined1  [16])0x0) {
                  auVar145 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar98);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar145;
                  pRVar58 = (RayHitK<4> *)args.ray;
                }
              }
              if ((_DAT_01fecb20 & auVar122) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar76;
                pRVar58 = ray;
              }
              valid.field_0.v[lVar56] = 0.0;
              fVar81 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(fVar130 <= fVar81) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(fVar119 <= fVar81) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(fVar131 <= fVar81) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar134 <= fVar81) & valid.field_0.i[3];
            }
            uVar53 = movmskps((int)pRVar58,(undefined1  [16])valid.field_0);
            if (uVar53 == 0) goto LAB_00296dc8;
            auVar215 = blendvps(_DAT_01feb9f0,auVar168,(undefined1  [16])valid.field_0);
            auVar158._4_4_ = auVar215._0_4_;
            auVar158._0_4_ = auVar215._4_4_;
            auVar158._8_4_ = auVar215._12_4_;
            auVar158._12_4_ = auVar215._8_4_;
            auVar145 = minps(auVar158,auVar215);
            auVar123._0_8_ = auVar145._8_8_;
            auVar123._8_4_ = auVar145._0_4_;
            auVar123._12_4_ = auVar145._4_4_;
            auVar145 = minps(auVar123,auVar145);
            auVar124._0_8_ =
                 CONCAT44(-(uint)(auVar145._4_4_ == auVar215._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar145._0_4_ == auVar215._0_4_) & valid.field_0._0_4_);
            auVar124._8_4_ = -(uint)(auVar145._8_4_ == auVar215._8_4_) & valid.field_0._8_4_;
            auVar124._12_4_ = -(uint)(auVar145._12_4_ == auVar215._12_4_) & valid.field_0._12_4_;
            iVar54 = movmskps(uVar53,auVar124);
            aVar99 = valid.field_0;
            if (iVar54 != 0) {
              aVar99.i[2] = auVar124._8_4_;
              aVar99._0_8_ = auVar124._0_8_;
              aVar99.i[3] = auVar124._12_4_;
            }
            uVar76 = movmskps(iVar54,(undefined1  [16])aVar99);
            uVar63 = CONCAT44((int)((ulong)pRVar58 >> 0x20),uVar76);
            lVar56 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
            goto LAB_00297153;
          }
        }
LAB_00296dc8:
        fVar230 = fVar83 - fVar230;
        fVar231 = fVar106 - fVar231;
        fStack_1350 = fVar110 - fVar232;
        fStack_134c = fVar114 - fVar233;
        fVar161 = fVar84 - fVar161;
        fVar169 = fVar107 - fVar169;
        fStack_1280 = fVar111 - fVar171;
        fStack_127c = fVar115 - fVar173;
        fVar241 = fVar85 - fVar241;
        fVar242 = fVar108 - fVar242;
        fVar243 = fVar112 - fVar243;
        fVar244 = fVar116 - fVar244;
        fVar120 = fVar120 - fVar83;
        fVar132 = fVar132 - fVar106;
        fVar133 = fStack_1220 - fVar110;
        fVar134 = fStack_121c - fVar114;
        fVar140 = fVar140 - fVar84;
        fVar148 = fVar148 - fVar107;
        fVar150 = fVar150 - fVar111;
        fVar152 = fVar152 - fVar115;
        fVar82 = fVar82 - fVar85;
        fVar105 = fVar105 - fVar108;
        fVar109 = fVar109 - fVar112;
        fVar113 = fVar113 - fVar116;
        local_10e8[0] = fVar140 * fVar241 - fVar82 * fVar161;
        local_10e8[1] = fVar148 * fVar242 - fVar105 * fVar169;
        local_10e8[2] = fVar150 * fVar243 - fVar109 * fStack_1280;
        local_10e8[3] = fVar152 * fVar244 - fVar113 * fStack_127c;
        fVar119 = fVar82 * fVar230 - fVar120 * fVar241;
        fVar129 = fVar105 * fVar231 - fVar132 * fVar242;
        fVar130 = fVar109 * fStack_1350 - fVar133 * fVar243;
        fVar131 = fVar113 * fStack_134c - fVar134 * fVar244;
        fVar135 = fVar120 * fVar161 - fVar140 * fVar230;
        fVar136 = fVar132 * fVar169 - fVar148 * fVar231;
        local_12f8 = CONCAT44(fVar136,fVar135);
        uStack_12f0._0_4_ = fVar133 * fStack_1280 - fVar150 * fStack_1350;
        uStack_12f0._4_4_ = fVar134 * fStack_127c - fVar152 * fStack_134c;
        fVar81 = *(float *)(ray + k * 4);
        fVar139 = *(float *)(ray + k * 4 + 0x10);
        fVar154 = *(float *)(ray + k * 4 + 0x20);
        fVar213 = *(float *)(ray + k * 4 + 0x40);
        fVar117 = *(float *)(ray + k * 4 + 0x50);
        fVar118 = *(float *)(ray + k * 4 + 0x60);
        fVar83 = fVar83 - fVar81;
        fVar106 = fVar106 - fVar81;
        fStack_1310 = fVar110 - fVar81;
        fStack_130c = fVar114 - fVar81;
        fVar84 = fVar84 - fVar139;
        fVar107 = fVar107 - fVar139;
        fVar111 = fVar111 - fVar139;
        fVar115 = fVar115 - fVar139;
        fVar85 = fVar85 - fVar154;
        fVar108 = fVar108 - fVar154;
        fVar112 = fVar112 - fVar154;
        fVar116 = fVar116 - fVar154;
        fVar162 = fVar84 * fVar118 - fVar85 * fVar117;
        fVar170 = fVar107 * fVar118 - fVar108 * fVar117;
        fVar171 = fVar111 * fVar118 - fVar112 * fVar117;
        fVar172 = fVar115 * fVar118 - fVar116 * fVar117;
        fVar141 = fVar85 * fVar213 - fVar83 * fVar118;
        fVar149 = fVar108 * fVar213 - fVar106 * fVar118;
        fVar151 = fVar112 * fVar213 - fStack_1310 * fVar118;
        fVar153 = fVar116 * fVar213 - fStack_130c * fVar118;
        fVar81 = fVar83 * fVar117 - fVar84 * fVar213;
        fVar139 = fVar106 * fVar117 - fVar107 * fVar213;
        fVar154 = fStack_1310 * fVar117 - fVar111 * fVar213;
        fVar110 = fStack_130c * fVar117 - fVar115 * fVar213;
        fVar114 = fVar213 * local_10e8[0] + fVar117 * fVar119 + fVar118 * fVar135;
        fVar137 = fVar213 * local_10e8[1] + fVar117 * fVar129 + fVar118 * fVar136;
        fVar138 = fVar213 * local_10e8[2] + fVar117 * fVar130 + fVar118 * (float)uStack_12f0;
        fVar213 = fVar213 * local_10e8[3] + fVar117 * fVar131 + fVar118 * uStack_12f0._4_4_;
        uVar202 = (uint)fVar114 & 0x80000000;
        uVar206 = (uint)fVar137 & 0x80000000;
        uVar208 = (uint)fVar138 & 0x80000000;
        uVar210 = (uint)fVar213 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar120 * fVar162 + fVar140 * fVar141 + fVar82 * fVar81) ^ uVar202;
        tNear.field_0.i[1] =
             (uint)(fVar132 * fVar170 + fVar148 * fVar149 + fVar105 * fVar139) ^ uVar206;
        tNear.field_0.i[2] =
             (uint)(fVar133 * fVar171 + fVar150 * fVar151 + fVar109 * fVar154) ^ uVar208;
        tNear.field_0.i[3] =
             (uint)(fVar134 * fVar172 + fVar152 * fVar153 + fVar113 * fVar110) ^ uVar210;
        fVar82 = (float)((uint)(fVar162 * fVar230 + fVar141 * fVar161 + fVar81 * fVar241) ^ uVar202)
        ;
        fVar105 = (float)((uint)(fVar170 * fVar231 + fVar149 * fVar169 + fVar139 * fVar242) ^
                         uVar206);
        fVar154 = (float)((uint)(fVar171 * fStack_1350 + fVar151 * fStack_1280 + fVar154 * fVar243)
                         ^ uVar208);
        fVar109 = (float)((uint)(fVar172 * fStack_134c + fVar153 * fStack_127c + fVar110 * fVar244)
                         ^ uVar210);
        fVar81 = ABS(fVar114);
        fVar139 = ABS(fVar137);
        auVar180._0_8_ = CONCAT44(fVar137,fVar114) & 0x7fffffff7fffffff;
        auVar180._8_4_ = ABS(fVar138);
        auVar180._12_4_ = ABS(fVar213);
        bVar44 = tNear.field_0.v[0] + fVar82 <= fVar81 &&
                 ((0.0 <= fVar82 && 0.0 <= tNear.field_0.v[0]) && fVar114 != 0.0);
        auVar186._0_4_ = -(uint)bVar44;
        bVar45 = tNear.field_0.v[1] + fVar105 <= fVar139 &&
                 ((0.0 <= fVar105 && 0.0 <= tNear.field_0.v[1]) && fVar137 != 0.0);
        auVar186._4_4_ = -(uint)bVar45;
        bVar43 = tNear.field_0.v[2] + fVar154 <= auVar180._8_4_ &&
                 ((0.0 <= fVar154 && 0.0 <= tNear.field_0.v[2]) && fVar138 != 0.0);
        auVar186._8_4_ = -(uint)bVar43;
        bVar42 = tNear.field_0.v[3] + fVar109 <= auVar180._12_4_ &&
                 ((0.0 <= fVar109 && 0.0 <= tNear.field_0.v[3]) && fVar213 != 0.0);
        auVar186._12_4_ = -(uint)bVar42;
        iVar54 = movmskps(uVar53,auVar186);
        if (iVar54 != 0) {
          fVar84 = (float)(uVar202 ^
                          (uint)(fVar83 * local_10e8[0] + fVar84 * fVar119 + fVar85 * fVar135));
          fVar85 = (float)(uVar206 ^
                          (uint)(fVar106 * local_10e8[1] + fVar107 * fVar129 + fVar108 * fVar136));
          fVar106 = (float)(uVar208 ^
                           (uint)(fStack_1310 * local_10e8[2] +
                                 fVar111 * fVar130 + fVar112 * (float)uStack_12f0));
          fVar107 = (float)(uVar210 ^
                           (uint)(fStack_130c * local_10e8[3] +
                                 fVar115 * fVar131 + fVar116 * uStack_12f0._4_4_));
          fVar213 = *(float *)(ray + k * 4 + 0x30);
          fVar83 = *(float *)(ray + k * 4 + 0x80);
          bVar44 = (fVar84 <= fVar83 * fVar81 && fVar213 * fVar81 < fVar84) && bVar44;
          bVar45 = (fVar85 <= fVar83 * fVar139 && fVar213 * fVar139 < fVar85) && bVar45;
          valid.field_0._0_8_ = CONCAT44(-(uint)bVar45,-(uint)bVar44);
          bVar43 = (fVar106 <= fVar83 * auVar180._8_4_ && fVar213 * auVar180._8_4_ < fVar106) &&
                   bVar43;
          valid.field_0.i[2] = -(uint)bVar43;
          bVar42 = (fVar107 <= fVar83 * auVar180._12_4_ && fVar213 * auVar180._12_4_ < fVar107) &&
                   bVar42;
          valid.field_0.i[3] = -(uint)bVar42;
          iVar54 = movmskps(iVar54,(undefined1  [16])valid.field_0);
          if (iVar54 != 0) {
            local_10b8._8_8_ = uStack_1010;
            local_10b8._0_8_ = local_1018;
            pSVar41 = context->scene;
            auVar145 = rcpps(auVar186,auVar180);
            fVar213 = auVar145._0_4_;
            fVar83 = auVar145._4_4_;
            fVar108 = auVar145._8_4_;
            fVar110 = auVar145._12_4_;
            fVar112 = (float)DAT_01feca10;
            fVar113 = DAT_01feca10._4_4_;
            fVar114 = DAT_01feca10._12_4_;
            fVar111 = DAT_01feca10._8_4_;
            fVar213 = (fVar112 - fVar81 * fVar213) * fVar213 + fVar213;
            fVar83 = (fVar113 - fVar139 * fVar83) * fVar83 + fVar83;
            fVar108 = (fVar111 - auVar180._8_4_ * fVar108) * fVar108 + fVar108;
            fVar110 = (fVar114 - auVar180._12_4_ * fVar110) * fVar110 + fVar110;
            fVar84 = fVar84 * fVar213;
            fVar85 = fVar85 * fVar83;
            fVar106 = fVar106 * fVar108;
            fVar107 = fVar107 * fVar110;
            local_10f8 = CONCAT44(fVar85,fVar84);
            uStack_10f0 = CONCAT44(fVar107,fVar106);
            auVar214._0_4_ = tNear.field_0.v[0] * fVar213;
            auVar214._4_4_ = tNear.field_0.v[1] * fVar83;
            auVar214._8_4_ = tNear.field_0.v[2] * fVar108;
            auVar214._12_4_ = tNear.field_0.v[3] * fVar110;
            auVar215 = minps(auVar214,_DAT_01feca10);
            auVar194._0_4_ = fVar213 * fVar82;
            auVar194._4_4_ = fVar83 * fVar105;
            auVar194._8_4_ = fVar108 * fVar154;
            auVar194._12_4_ = fVar110 * fVar109;
            auVar145 = minps(auVar194,_DAT_01feca10);
            auVar181._0_4_ = fVar112 - auVar215._0_4_;
            auVar181._4_4_ = fVar113 - auVar215._4_4_;
            auVar181._8_4_ = fVar111 - auVar215._8_4_;
            auVar181._12_4_ = fVar114 - auVar215._12_4_;
            auVar188._0_4_ = fVar112 - auVar145._0_4_;
            auVar188._4_4_ = fVar113 - auVar145._4_4_;
            auVar188._8_4_ = fVar111 - auVar145._8_4_;
            auVar188._12_4_ = fVar114 - auVar145._12_4_;
            local_1118 = blendvps(auVar215,auVar181,local_10b8);
            local_1108 = blendvps(auVar145,auVar188,local_10b8);
            local_10d8 = CONCAT44(fVar129,fVar119);
            uStack_10d0 = CONCAT44(fVar131,fVar130);
            local_10c8 = local_12f8;
            uStack_10c0 = uStack_12f0;
            auVar100._8_4_ = valid.field_0.i[2];
            auVar100._0_8_ = valid.field_0._0_8_;
            auVar100._12_4_ = valid.field_0.i[3];
            auVar46._4_4_ = fVar85;
            auVar46._0_4_ = fVar84;
            auVar46._8_4_ = fVar106;
            auVar46._12_4_ = fVar107;
            auVar215 = blendvps(_DAT_01feb9f0,auVar46,auVar100);
            auVar159._4_4_ = auVar215._0_4_;
            auVar159._0_4_ = auVar215._4_4_;
            auVar159._8_4_ = auVar215._12_4_;
            auVar159._12_4_ = auVar215._8_4_;
            auVar145 = minps(auVar159,auVar215);
            auVar101._0_8_ = auVar145._8_8_;
            auVar101._8_4_ = auVar145._0_4_;
            auVar101._12_4_ = auVar145._4_4_;
            auVar145 = minps(auVar101,auVar145);
            auVar102._0_8_ =
                 CONCAT44(-(uint)(auVar145._4_4_ == auVar215._4_4_ && bVar45),
                          -(uint)(auVar145._0_4_ == auVar215._0_4_ && bVar44));
            auVar102._8_4_ = -(uint)(auVar145._8_4_ == auVar215._8_4_ && bVar43);
            auVar102._12_4_ = -(uint)(auVar145._12_4_ == auVar215._12_4_ && bVar42);
            iVar54 = movmskps((int)context,auVar102);
            aVar125 = valid.field_0;
            if (iVar54 != 0) {
              aVar125.i[2] = auVar102._8_4_;
              aVar125._0_8_ = auVar102._0_8_;
              aVar125.i[3] = auVar102._12_4_;
            }
            uVar76 = movmskps(iVar54,(undefined1  [16])aVar125);
            uVar63 = CONCAT44((int)((ulong)context >> 0x20),uVar76);
            lVar56 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
LAB_002976ab:
            uVar53 = *(uint *)(lVar34 + 0x40 + lVar56 * 4);
            pRVar58 = (RayHitK<4> *)(ulong)uVar53;
            pGVar33 = (pSVar41->geometries).items[(long)pRVar58].ptr;
            if ((pGVar33->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar56] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar33->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar76 = *(undefined4 *)(local_1118 + lVar56 * 4);
                uVar30 = *(undefined4 *)(local_1108 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) =
                     *(undefined4 *)((long)&local_10f8 + lVar56 * 4);
                *(float *)(ray + k * 4 + 0xc0) = local_10e8[lVar56];
                *(undefined4 *)(ray + k * 4 + 0xd0) =
                     *(undefined4 *)((long)&local_10d8 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)((long)&local_10c8 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar76;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar30;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar34 + 0x50 + lVar56 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar53;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00296f8d;
              }
              local_1078 = *(undefined4 *)(local_1118 + lVar56 * 4);
              local_1068 = *(undefined4 *)(local_1108 + lVar56 * 4);
              fVar81 = local_10e8[lVar56];
              uVar76 = *(undefined4 *)((long)&local_10d8 + lVar56 * 4);
              local_1048._4_4_ = uVar53;
              local_1048._0_4_ = uVar53;
              local_1048._8_4_ = uVar53;
              local_1048._12_4_ = uVar53;
              uVar30 = *(undefined4 *)(lVar34 + 0x50 + lVar56 * 4);
              local_1058._4_4_ = uVar30;
              local_1058._0_4_ = uVar30;
              local_1058._8_4_ = uVar30;
              local_1058._12_4_ = uVar30;
              local_10a8._4_4_ = fVar81;
              local_10a8._0_4_ = fVar81;
              fStack_10a0 = fVar81;
              fStack_109c = fVar81;
              local_1098._4_4_ = uVar76;
              local_1098._0_4_ = uVar76;
              local_1098._8_4_ = uVar76;
              local_1098._12_4_ = uVar76;
              uVar76 = *(undefined4 *)((long)&local_10c8 + lVar56 * 4);
              local_1088._4_4_ = uVar76;
              local_1088._0_4_ = uVar76;
              local_1088._8_4_ = uVar76;
              local_1088._12_4_ = uVar76;
              uStack_1074 = local_1078;
              uStack_1070 = local_1078;
              uStack_106c = local_1078;
              uStack_1064 = local_1068;
              uStack_1060 = local_1068;
              uStack_105c = local_1068;
              local_1038 = context->user->instID[0];
              uStack_1034 = local_1038;
              uStack_1030 = local_1038;
              uStack_102c = local_1038;
              local_1028 = context->user->instPrimID[0];
              uStack_1024 = local_1028;
              uStack_1020 = local_1028;
              uStack_101c = local_1028;
              uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)&local_10f8 + lVar56 * 4);
              uStack_12e0 = local_1278[1];
              local_12e8 = (int)*local_1278;
              iStack_12e4 = (int)((ulong)*local_1278 >> 0x20);
              args.valid = &local_12e8;
              args.geometryUserPtr = pGVar33->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_10a8;
              args.N = 4;
              pRVar58 = (RayHitK<4> *)pGVar33->intersectionFilterN;
              args.ray = (RTCRayN *)ray;
              if (pRVar58 != (RayHitK<4> *)0x0) {
                pRVar58 = (RayHitK<4> *)(*(code *)pRVar58)(&args);
              }
              auVar50._4_4_ = iStack_12e4;
              auVar50._0_4_ = local_12e8;
              auVar50._8_8_ = uStack_12e0;
              if (auVar50 == (undefined1  [16])0x0) {
                auVar126._8_4_ = 0xffffffff;
                auVar126._0_8_ = 0xffffffffffffffff;
                auVar126._12_4_ = 0xffffffff;
                auVar126 = auVar126 ^ _DAT_01febe20;
              }
              else {
                pRVar58 = (RayHitK<4> *)context->args->filter;
                if ((pRVar58 != (RayHitK<4> *)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar33->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  pRVar58 = (RayHitK<4> *)(*(code *)pRVar58)(&args);
                }
                auVar51._4_4_ = iStack_12e4;
                auVar51._0_4_ = local_12e8;
                auVar51._8_8_ = uStack_12e0;
                auVar103._0_4_ = -(uint)(local_12e8 == 0);
                auVar103._4_4_ = -(uint)(iStack_12e4 == 0);
                auVar103._8_4_ = -(uint)((int)uStack_12e0 == 0);
                auVar103._12_4_ = -(uint)((int)((ulong)uStack_12e0 >> 0x20) == 0);
                auVar126 = auVar103 ^ _DAT_01febe20;
                if (auVar51 != (undefined1  [16])0x0) {
                  auVar145 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar145;
                  auVar145 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar103);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar145;
                  pRVar58 = (RayHitK<4> *)args.ray;
                }
              }
              if ((_DAT_01fecb20 & auVar126) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar76;
                pRVar58 = ray;
              }
              valid.field_0.v[lVar56] = 0.0;
              fVar81 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(fVar85 <= fVar81) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(fVar84 <= fVar81) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(fVar106 <= fVar81) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar107 <= fVar81) & valid.field_0.i[3];
            }
            iVar54 = movmskps((int)pRVar58,(undefined1  [16])valid.field_0);
            if (iVar54 == 0) goto LAB_00296f8d;
            auVar47._4_4_ = fVar85;
            auVar47._0_4_ = fVar84;
            auVar47._8_4_ = fVar106;
            auVar47._12_4_ = fVar107;
            auVar215 = blendvps(_DAT_01feb9f0,auVar47,(undefined1  [16])valid.field_0);
            auVar160._4_4_ = auVar215._0_4_;
            auVar160._0_4_ = auVar215._4_4_;
            auVar160._8_4_ = auVar215._12_4_;
            auVar160._12_4_ = auVar215._8_4_;
            auVar145 = minps(auVar160,auVar215);
            auVar127._0_8_ = auVar145._8_8_;
            auVar127._8_4_ = auVar145._0_4_;
            auVar127._12_4_ = auVar145._4_4_;
            auVar145 = minps(auVar127,auVar145);
            auVar128._0_8_ =
                 CONCAT44(-(uint)(auVar145._4_4_ == auVar215._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar145._0_4_ == auVar215._0_4_) & valid.field_0._0_4_);
            auVar128._8_4_ = -(uint)(auVar145._8_4_ == auVar215._8_4_) & valid.field_0._8_4_;
            auVar128._12_4_ = -(uint)(auVar145._12_4_ == auVar215._12_4_) & valid.field_0._12_4_;
            iVar54 = movmskps(iVar54,auVar128);
            aVar104 = valid.field_0;
            if (iVar54 != 0) {
              aVar104.i[2] = auVar128._8_4_;
              aVar104._0_8_ = auVar128._0_8_;
              aVar104.i[3] = auVar128._12_4_;
            }
            uVar76 = movmskps(iVar54,(undefined1  [16])aVar104);
            uVar63 = CONCAT44((int)((ulong)pRVar58 >> 0x20),uVar76);
            lVar56 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
            goto LAB_002976ab;
          }
        }
LAB_00296f8d:
        lVar57 = lVar57 + 1;
      } while (lVar57 != uVar55 - 8);
    }
    uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar215._4_4_ = uVar76;
    auVar215._0_4_ = uVar76;
    auVar215._8_4_ = uVar76;
    auVar215._12_4_ = uVar76;
    auVar145 = local_fe8;
    fVar81 = local_ff8;
    fVar139 = fStack_ff4;
    fVar154 = fStack_ff0;
    fVar213 = fStack_fec;
    fVar82 = local_fd8;
    fVar83 = fStack_fd4;
    fVar84 = fStack_fd0;
    fVar85 = fStack_fcc;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }